

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O0

bool stl_reader::StlFileHasASCIIFormat(char *filename)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  string local_3f8 [8];
  string firstWord;
  string local_3d0 [32];
  stringstream local_3b0 [8];
  stringstream ss;
  ostream local_3a0 [392];
  long local_218;
  ifstream in;
  char *filename_local;
  
  std::ifstream::ifstream(&local_218,filename,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_3f8);
    std::operator>>((istream *)&local_218,local_3f8);
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
              (__first,__last,__result,tolower);
    iVar2 = std::__cxx11::string::compare((char *)local_3f8);
    std::__cxx11::string::~string(local_3f8);
    std::ifstream::~ifstream(&local_218);
    return iVar2 == 0;
  }
  std::__cxx11::stringstream::stringstream(local_3b0);
  poVar3 = std::operator<<(local_3a0,"Couldnt open file ");
  std::operator<<(poVar3,filename);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_3d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline bool StlFileHasASCIIFormat(const char* filename)
{
	using namespace std;
	ifstream in(filename);
	STL_READER_COND_THROW(!in, "Couldnt open file " << filename);

	string firstWord;
	in >> firstWord;
	transform(firstWord.begin(), firstWord.end(), firstWord.begin(), ::tolower);

	return firstWord.compare("solid") == 0;
}